

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

FILE * pugi::impl::anon_unknown_0::open_file_wide(wchar_t *path,wchar_t *mode)

{
  size_t i;
  size_t length;
  size_t size;
  char *buffer;
  long lVar1;
  FILE *pFVar2;
  char mode_ascii [4];
  char local_2c [4];
  
  if (path != (wchar_t *)0x0) {
    length = strlength_wide(path);
    size = as_utf8_begin(path,length);
    buffer = (char *)(*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::
                               allocate)(size + 1);
    if (buffer == (char *)0x0) {
      pFVar2 = (FILE *)0x0;
    }
    else {
      as_utf8_end(buffer,size,path,length);
      buffer[size] = '\0';
      local_2c[0] = '\0';
      local_2c[1] = '\0';
      local_2c[2] = '\0';
      local_2c[3] = '\0';
      for (lVar1 = 0; mode[lVar1] != L'\0'; lVar1 = lVar1 + 1) {
        local_2c[lVar1] = (char)mode[lVar1];
      }
      pFVar2 = fopen(buffer,local_2c);
      (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate)
                (buffer);
    }
    return (FILE *)pFVar2;
  }
  __assert_fail("str",
                "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/pugixml.cpp"
                ,0x13b2,
                "char *pugi::impl::(anonymous namespace)::convert_path_heap(const wchar_t *)");
}

Assistant:

PUGI_IMPL_FN char* convert_path_heap(const wchar_t* str)
	{
		assert(str);

		// first pass: get length in utf8 characters
		size_t length = strlength_wide(str);
		size_t size = as_utf8_begin(str, length);

		// allocate resulting string
		char* result = static_cast<char*>(xml_memory::allocate(size + 1));
		if (!result) return 0;

		// second pass: convert to utf8
		as_utf8_end(result, size, str, length);

		// zero-terminate
		result[size] = 0;

		return result;
	}